

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_expr.cc
# Opt level: O0

void __thiscall expr_const_val_Test::TestBody(expr_const_val_Test *this)

{
  bool bVar1;
  Generator *pGVar2;
  char *pcVar3;
  AssertHelper local_778;
  Message local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  undefined1 local_748 [8];
  AssertionResult gtest_ar_1;
  Message local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  undefined1 local_708 [8];
  AssertionResult gtest_ar;
  Const *c1;
  Message local_6e8;
  byte local_6d9;
  Const *pCStack_6d8;
  bool gtest_caught_any;
  Const *c0;
  allocator<char> local_6b9;
  string local_6b8;
  undefined1 local_698 [8];
  Generator mod;
  Context c;
  expr_const_val_Test *this_local;
  
  kratos::Context::Context((Context *)&mod.use_stmts_remove_cache_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"mod",&local_6b9);
  pGVar2 = kratos::Context::generator((Context *)&mod.use_stmts_remove_cache_,&local_6b8);
  kratos::Generator::Generator((Generator *)local_698,pGVar2);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  pCStack_6d8 = kratos::constant(10,4,false);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_6d9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      kratos::constant(10,4,true);
    }
    if ((local_6d9 & 1) != 0) goto LAB_00141b39;
  }
  testing::Message::Message(&local_6e8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&c1,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc",
             0x74,"Expected: constant(10, 4, true) throws an exception.\n  Actual: it doesn\'t.");
  testing::internal::AssertHelper::operator=((AssertHelper *)&c1,&local_6e8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&c1);
  testing::Message::~Message(&local_6e8);
LAB_00141b39:
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )kratos::constant(-4,4,true);
  (*(pCStack_6d8->super_Var).super_IRNode._vptr_IRNode[0x1f])(&local_728);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_708,"c0.to_string()","\"4\'hA\"",&local_728,(char (*) [5])"4\'hA");
  std::__cxx11::string::~string((string *)&local_728);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar1) {
    testing::Message::Message(&local_730);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_708);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x76,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_730);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_730);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  (**(code **)(*(long *)gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 0xf8))(&local_768);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
            ((EqHelper *)local_748,"c1.to_string()","\"-4\'h4\"",&local_768,(char (*) [6])"-4\'h4");
  std::__cxx11::string::~string((string *)&local_768);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_748);
  if (!bVar1) {
    testing::Message::Message(&local_770);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_748);
    testing::internal::AssertHelper::AssertHelper
              (&local_778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_expr.cc"
               ,0x77,pcVar3);
    testing::internal::AssertHelper::operator=(&local_778,&local_770);
    testing::internal::AssertHelper::~AssertHelper(&local_778);
    testing::Message::~Message(&local_770);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_748);
  kratos::Generator::~Generator((Generator *)local_698);
  kratos::Context::~Context((Context *)&mod.use_stmts_remove_cache_);
  return;
}

Assistant:

TEST(expr, const_val) {  // NOLINT
    Context c;
    auto mod = c.generator("mod");
    auto &c0 = constant(10, 4);
    EXPECT_ANY_THROW(constant(10, 4, true));
    auto &c1 = constant(-4, 4, true);
    EXPECT_EQ(c0.to_string(), "4'hA");
    EXPECT_EQ(c1.to_string(), "-4'h4");
}